

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O3

int Bus_SclCompareFanouts(Abc_Obj_t **pp1,Abc_Obj_t **pp2)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  long lVar6;
  void *pvVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  
  iVar3 = (*pp1)->Id;
  lVar10 = (long)iVar3;
  if (-1 < lVar10) {
    pvVar5 = (*pp1)->pNtk->pBSMan;
    lVar6 = *(long *)((long)pvVar5 + 0x40);
    if (iVar3 < *(int *)(lVar6 + 4)) {
      iVar4 = (*pp2)->Id;
      lVar11 = (long)iVar4;
      if (-1 < lVar11) {
        pvVar7 = (*pp2)->pNtk->pBSMan;
        lVar8 = *(long *)((long)pvVar7 + 0x40);
        if (iVar4 < *(int *)(lVar8 + 4)) {
          fVar1 = *(float *)(*(long *)(lVar6 + 8) + lVar10 * 4);
          fVar2 = *(float *)(*(long *)(lVar8 + 8) + lVar11 * 4);
          iVar9 = -1;
          if ((fVar2 <= fVar1) && (iVar9 = 1, fVar1 <= fVar2)) {
            lVar6 = *(long *)((long)pvVar5 + 0x38);
            if ((*(int *)(lVar6 + 4) <= iVar3) ||
               (lVar8 = *(long *)((long)pvVar7 + 0x38), *(int *)(lVar8 + 4) <= iVar4))
            goto LAB_003df3c0;
            fVar1 = *(float *)(*(long *)(lVar6 + 8) + lVar10 * 4);
            fVar2 = *(float *)(*(long *)(lVar8 + 8) + lVar11 * 4);
            iVar9 = -1;
            if (fVar1 <= fVar2) {
              iVar9 = (uint)(fVar1 < fVar2) * 2 + -1;
            }
          }
          return iVar9;
        }
      }
    }
  }
LAB_003df3c0:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecFlt.h"
                ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
}

Assistant:

int Bus_SclCompareFanouts( Abc_Obj_t ** pp1, Abc_Obj_t ** pp2 )
{
    float Espilon = 0;//10; // 10 ps
    if ( Bus_SclObjETime(*pp1) < Bus_SclObjETime(*pp2) - Espilon )
        return -1;
    if ( Bus_SclObjETime(*pp1) > Bus_SclObjETime(*pp2) + Espilon )
        return 1;
    if ( Bus_SclObjCin(*pp1) > Bus_SclObjCin(*pp2) )
        return -1;
    if ( Bus_SclObjCin(*pp1) < Bus_SclObjCin(*pp2) )
        return 1;
    return -1;
}